

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::WildcardPattern::WildcardPattern
          (WildcardPattern *this,string *pattern,Choice caseSensitivity)

{
  bool bVar1;
  byte bVar2;
  undefined4 in_EDX;
  undefined8 *in_RDI;
  string *in_stack_ffffffffffffff00;
  undefined8 *puVar3;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  string *prefix;
  string *s;
  allocator *suffix;
  string *in_stack_ffffffffffffff48;
  allocator local_91;
  string local_90 [32];
  string local_70 [55];
  allocator local_39;
  string local_38 [56];
  
  *in_RDI = &PTR__WildcardPattern_00280ca0;
  *(undefined4 *)(in_RDI + 1) = in_EDX;
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  prefix = (string *)(in_RDI + 2);
  s = prefix;
  adjustCase((WildcardPattern *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
             in_stack_ffffffffffffff00);
  suffix = &local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"*",suffix);
  bVar1 = startsWith(s,prefix);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (bVar1) {
    std::__cxx11::string::substr((ulong)local_70,(ulong)(in_RDI + 2));
    std::__cxx11::string::operator=((string *)(in_RDI + 2),local_70);
    std::__cxx11::string::~string(local_70);
    *(undefined4 *)((long)in_RDI + 0xc) = 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"*",&local_91);
  bVar2 = endsWith(in_stack_ffffffffffffff48,(string *)suffix);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  if ((bVar2 & 1) != 0) {
    puVar3 = in_RDI + 2;
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&stack0xffffffffffffff48,(ulong)puVar3);
    std::__cxx11::string::operator=((string *)(in_RDI + 2),(string *)&stack0xffffffffffffff48);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
    *(uint *)((long)in_RDI + 0xc) = *(uint *)((long)in_RDI + 0xc) | 2;
  }
  return;
}

Assistant:

WildcardPattern( std::string const& pattern, CaseSensitive::Choice caseSensitivity )
        :   m_caseSensitivity( caseSensitivity ),
            m_wildcard( NoWildcard ),
            m_pattern( adjustCase( pattern ) )
        {
            if( startsWith( m_pattern, "*" ) ) {
                m_pattern = m_pattern.substr( 1 );
                m_wildcard = WildcardAtStart;
            }
            if( endsWith( m_pattern, "*" ) ) {
                m_pattern = m_pattern.substr( 0, m_pattern.size()-1 );
                m_wildcard = static_cast<WildcardPosition>( m_wildcard | WildcardAtEnd );
            }
        }